

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_foreach::statement_foreach
          (statement_foreach *this,string *it,tree_type<cs::token_base_*> *tree,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *b,context_t *c,
          token_base *ptr)

{
  statement_base *in_RSI;
  undefined8 *in_RDI;
  token_base *in_R8;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffff68;
  context_t *c_00;
  context_t local_40 [4];
  
  c_00 = local_40;
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_R8,
             (shared_ptr<cs::context_type> *)in_stack_ffffffffffffff68);
  statement_base::statement_base(in_RSI,c_00,in_R8);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x257fb4);
  *in_RDI = &PTR__statement_foreach_003df658;
  std::__cxx11::string::string((string *)(in_RDI + 4),(string *)in_RSI);
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)in_R8,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffff68);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_R8,
             in_stack_ffffffffffffff68);
  return;
}

Assistant:

statement_foreach(std::string it, tree_type<token_base *> tree, std::deque<statement_base *> b, context_t c,
		                  token_base *ptr) : statement_base(std::move(c), ptr), mIt(std::move(it)),
			mObj(std::move(tree)), mBlock(std::move(b)) {}